

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O2

void __thiscall PatternGeneration::PatternGeneration(PatternGeneration *this)

{
  param_type *__p;
  __shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  (this->dist).super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->dist).super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (param_type *)operator_new(8);
  __p->_M_a = 0;
  __p->_M_b = 0x7fffffff;
  std::__shared_ptr<std::uniform_int_distribution<int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::uniform_int_distribution<int>,void>
            ((__shared_ptr<std::uniform_int_distribution<int>,(__gnu_cxx::_Lock_policy)2> *)
             &local_28,(uniform_int_distribution<int> *)__p);
  std::__shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2> *)this,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

PatternGeneration::PatternGeneration(){
    dist=std::shared_ptr<std::uniform_int_distribution<int> > (new std::uniform_int_distribution<int> ());
}